

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructGet *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_01;
  const_reference pvVar2;
  element_type *peVar3;
  Literal *pLVar4;
  Literal local_d0;
  Literal local_b8;
  uintptr_t local_a0;
  undefined1 auStack_98 [8];
  value_type field;
  shared_ptr<wasm::GCData> data;
  undefined1 local_68 [8];
  Flow ref;
  StructGet *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,this_00,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::getGCData();
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&field.packedType);
    if (!bVar1) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    local_a0 = (uintptr_t)
               Type::getHeapType((Type *)(*(long *)(ref.breakTo.super_IString.str._M_str + 0x18) + 8
                                         ));
    this_01 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)::wasm::HeapType::getStruct();
    pvVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                       (this_01,(ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
    auStack_98 = (undefined1  [8])(pvVar2->type).id;
    field.type.id._0_4_ = pvVar2->packedType;
    field.type.id._4_4_ = pvVar2->mutable_;
    peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&field.packedType);
    pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                       (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>,
                        (ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
    ::wasm::Literal::Literal(&local_d0,pLVar4);
    extendForPacking(&local_b8,this,&local_d0,(Field *)auStack_98,
                     (bool)(ref.breakTo.super_IString.str._M_str[0x20] & 1));
    Flow::Flow(__return_storage_ptr__,&local_b8);
    ::wasm::Literal::~Literal(&local_b8);
    ::wasm::Literal::~Literal(&local_d0);
    std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&field.packedType);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructGet(StructGet* curr) {
    NOTE_ENTER("StructGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    return extendForPacking(data->values[curr->index], field, curr->signed_);
  }